

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzArEx_Open(CSzArEx *p,ILookInStream *inStream,ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  SRes SVar1;
  CSzArEx *in_RCX;
  SRes res;
  ISzAlloc *in_stack_000000d0;
  ISzAlloc *in_stack_000000d8;
  ILookInStream *in_stack_000000e0;
  CSzArEx *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffffd8;
  
  SVar1 = SzArEx_Open2(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  if (SVar1 != 0) {
    SzArEx_Free(in_RCX,(ISzAlloc *)CONCAT44(SVar1,in_stack_ffffffffffffffd8));
  }
  return SVar1;
}

Assistant:

SRes SzArEx_Open(CSzArEx *p, ILookInStream *inStream,
    ISzAlloc *allocMain, ISzAlloc *allocTemp)
{
  SRes res = SzArEx_Open2(p, inStream, allocMain, allocTemp);
  if (res != SZ_OK)
    SzArEx_Free(p, allocMain);
  return res;
}